

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O3

void __thiscall
deqp::gls::BuiltinPrecisionTests::PrecisionCase::
testStatement<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,4>,tcu::Vector<float,3>,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void>,deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,4,3>,deqp::gls::BuiltinPrecisionTests::Void>>
          (PrecisionCase *this,
          Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_4>,_tcu::Vector<float,_3>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_4,_3>,_deqp::gls::BuiltinPrecisionTests::Void>_>
          *variables,
          Inputs<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_4>,_tcu::Vector<float,_3>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
          *inputs,Statement *stmt)

{
  bool *pbVar1;
  _Rb_tree_node_base *p_Var2;
  ostringstream *poVar3;
  ostream *poVar4;
  pointer pVVar5;
  pointer pVVar6;
  pointer pVVar7;
  Variable<tcu::Vector<float,_4>_> *pVVar8;
  pointer pcVar9;
  Variable<tcu::Vector<float,_3>_> *pVVar10;
  Variable<tcu::Matrix<float,_4,_3>_> *pVVar11;
  double dVar12;
  PrecisionCase *pPVar13;
  FloatFormat *fmt;
  undefined8 uVar14;
  bool bVar15;
  ContextType type;
  int iVar16;
  uint uVar17;
  _Rb_tree_node_base *p_Var18;
  char *__s;
  size_t sVar19;
  long *plVar20;
  ShaderExecutor *pSVar21;
  long lVar22;
  IVal *pIVar23;
  IVal *pIVar24;
  IVal *pIVar25;
  TestError *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar26;
  undefined1 *puVar27;
  Vector<float,_4> *val;
  Vector<float,_3> *val_00;
  size_t sVar28;
  undefined8 *puVar29;
  long lVar30;
  ulong uVar31;
  Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_4>,_tcu::Vector<float,_3>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_4,_3>,_deqp::gls::BuiltinPrecisionTests::Void>_>
  *pVVar32;
  Interval *__return_storage_ptr__;
  byte bVar33;
  IVal in2;
  IVal reference1;
  FuncSet funcs;
  IVal in3;
  ostringstream os;
  Environment env;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_4,_3>,_deqp::gls::BuiltinPrecisionTests::Void>_>
  outputs;
  FloatFormat highpFmt;
  ShaderSpec spec;
  ostringstream oss;
  undefined1 auStack_528 [8];
  PrecisionCase *local_520;
  undefined1 local_518 [8];
  size_type sStack_510;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_508;
  Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_4>,_tcu::Vector<float,_3>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_4,_3>,_deqp::gls::BuiltinPrecisionTests::Void>_>
  *local_4f8;
  IVal local_4e9;
  Inputs<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_4>,_tcu::Vector<float,_3>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
  *local_4e8;
  Statement *local_4e0;
  size_t local_4d8;
  ulong local_4d0;
  undefined1 local_4c8 [16];
  undefined1 local_4b8 [24];
  double local_4a0;
  string local_468;
  undefined1 local_448 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_438;
  double local_428;
  Data local_420;
  Interval local_410 [2];
  ios_base local_3d8 [8];
  ios_base local_3d0 [272];
  ulong local_2c0;
  ResultCollector *local_2b8;
  FloatFormat *local_2b0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  local_2a8;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_4,_3>,_deqp::gls::BuiltinPrecisionTests::Void>_>
  local_278;
  FloatFormat local_248;
  undefined1 local_220 [56];
  _Alloc_hider local_1e8;
  size_type local_1e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8;
  _Alloc_hider local_1c8;
  size_type local_1c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  bVar33 = 0;
  pVVar5 = (inputs->in0).
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pVVar6 = (inputs->in0).
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  sVar28 = (long)pVVar6 - (long)pVVar5 >> 4;
  local_4f8 = variables;
  local_4e8 = inputs;
  local_4e0 = stmt;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_4,_3>,_deqp::gls::BuiltinPrecisionTests::Void>_>
  ::Outputs(&local_278,sVar28);
  local_1e8._M_p = (pointer)&local_1d8;
  local_220._0_4_ = GLSL_VERSION_300_ES;
  local_220._8_8_ = (pointer)0x0;
  local_220._16_8_ = (pointer)0x0;
  local_220._24_8_ = (pointer)0x0;
  local_220._32_8_ = (pointer)0x0;
  local_220._40_8_ = (pointer)0x0;
  local_220._48_8_ = (pointer)0x0;
  local_1e0 = 0;
  local_1d8._M_local_buf[0] = '\0';
  local_1c8._M_p = (pointer)&local_1b8;
  local_1c0 = 0;
  local_1b8._M_local_buf[0] = '\0';
  local_248.m_maxValue = (this->m_ctx).highpFormat.m_maxValue;
  local_248.m_minExp = (this->m_ctx).highpFormat.m_minExp;
  local_248.m_maxExp = (this->m_ctx).highpFormat.m_maxExp;
  local_248.m_fractionBits = (this->m_ctx).highpFormat.m_fractionBits;
  local_248.m_hasSubnormal = (this->m_ctx).highpFormat.m_hasSubnormal;
  local_248.m_hasInf = (this->m_ctx).highpFormat.m_hasInf;
  local_248.m_hasNaN = (this->m_ctx).highpFormat.m_hasNaN;
  local_248.m_exactPrecision = (this->m_ctx).highpFormat.m_exactPrecision;
  local_248._25_7_ = *(undefined7 *)&(this->m_ctx).highpFormat.field_0x19;
  local_2a8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_2a8._M_impl.super__Rb_tree_header._M_header;
  local_2a8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_2a8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_2a8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_448._0_8_ = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  poVar3 = (ostringstream *)(local_448 + 8);
  local_520 = this;
  local_2a8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_2a8._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::ostringstream::ostringstream(poVar3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"Statement: ",0xb);
  (*local_4e0->_vptr_Statement[2])(local_4e0,poVar3);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_448,(EndMessageToken *)&tcu::TestLog::EndMessage);
  local_4d8 = sVar28;
  std::__cxx11::ostringstream::~ostringstream(poVar3);
  std::ios_base::~ios_base(local_3d0);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  p_Var2 = (_Rb_tree_node_base *)(local_4c8 + 8);
  local_4c8._8_4_ = _S_red;
  local_4b8._0_8_ = (_Base_ptr)0x0;
  local_4a0 = 0.0;
  local_4b8._8_8_ = p_Var2;
  local_4b8._16_8_ = p_Var2;
  (*local_4e0->_vptr_Statement[4])(local_4e0,local_4c8);
  if ((_Rb_tree_node_base *)local_4b8._8_8_ != p_Var2) {
    p_Var18 = (_Rb_tree_node_base *)local_4b8._8_8_;
    do {
      (**(code **)(**(long **)(p_Var18 + 1) + 0x30))(*(long **)(p_Var18 + 1),local_1a8);
      p_Var18 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var18);
    } while (p_Var18 != p_Var2);
  }
  if (local_4a0 != 0.0) {
    local_448._0_8_ = ((local_520->super_TestCase).super_TestNode.m_testCtx)->m_log;
    poVar3 = (ostringstream *)(local_448 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar3,"Reference definitions:\n",0x17);
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar3,(char *)local_518,sStack_510);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_448,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if (local_518 != (undefined1  [8])(local_518 + 0x10)) {
      operator_delete((void *)local_518,local_508._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream(poVar3);
    std::ios_base::~ios_base(local_3d0);
  }
  std::
  _Rb_tree<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::_Identity<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
  ::~_Rb_tree((_Rb_tree<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::_Identity<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
               *)local_4c8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_448);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_448,"precision ",10);
  __s = glu::getPrecisionName((local_520->m_ctx).precision);
  if (__s == (char *)0x0) {
    std::ios::clear((int)(auStack_528 + *(long *)(local_448._0_8_ + -0x18)) + 0xe0);
  }
  else {
    sVar19 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_448,__s,sVar19);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_448," float;\n",8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_1e8,(string *)local_1a8);
  pcVar9 = local_1a8 + 0x10;
  if ((pointer)local_1a8._0_8_ != pcVar9) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_448);
  std::ios_base::~ios_base(local_3d8);
  type.super_ApiType.m_bits =
       (ApiType)(*((local_520->m_ctx).renderContext)->_vptr_RenderContext[2])();
  pVVar32 = local_4f8;
  local_220._0_4_ = glu::getContextTypeGLSLVersion(type);
  if ((local_520->m_extension)._M_string_length != 0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
                   "#extension ",&local_520->m_extension);
    plVar20 = (long *)std::__cxx11::string::append(local_1a8);
    paVar26 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar20 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar20 == paVar26) {
      local_438._M_allocated_capacity = paVar26->_M_allocated_capacity;
      local_438._8_8_ = plVar20[3];
      local_448._0_8_ = &local_438;
    }
    else {
      local_438._M_allocated_capacity = paVar26->_M_allocated_capacity;
      local_448._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*plVar20;
    }
    local_448._8_8_ = plVar20[1];
    *plVar20 = (long)paVar26;
    plVar20[1] = 0;
    *(undefined1 *)(plVar20 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_1e8,(string *)local_448);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_448._0_8_ != &local_438) {
      operator_delete((void *)local_448._0_8_,local_438._M_allocated_capacity + 1);
    }
    pVVar32 = local_4f8;
    if ((pointer)local_1a8._0_8_ != pcVar9) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::resize((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
            *)(local_220 + 8),2);
  makeSymbol<tcu::Vector<float,3>>
            ((Symbol *)local_448,local_520,
             (pVVar32->in1).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_3>_>_>
             .m_ptr);
  uVar14 = local_220._8_8_;
  std::__cxx11::string::operator=((string *)(local_220._8_8_ + 0x38),(string *)local_448);
  glu::VarType::operator=(&((pointer)(uVar14 + 0x38))->varType,(VarType *)&local_428);
  glu::VarType::~VarType((VarType *)&local_428);
  pVVar32 = local_4f8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_448._0_8_ != &local_438) {
    operator_delete((void *)local_448._0_8_,local_438._M_allocated_capacity + 1);
  }
  makeSymbol<tcu::Vector<float,4>>
            ((Symbol *)local_448,local_520,
             (pVVar32->in0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_4>_>_>
             .m_ptr);
  uVar14 = local_220._8_8_;
  std::__cxx11::string::operator=((string *)local_220._8_8_,(string *)local_448);
  glu::VarType::operator=((VarType *)(uVar14 + 0x20),(VarType *)&local_428);
  glu::VarType::~VarType((VarType *)&local_428);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_448._0_8_ != &local_438) {
    operator_delete((void *)local_448._0_8_,local_438._M_allocated_capacity + 1);
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::resize((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
            *)(local_220 + 0x20),1);
  makeSymbol<tcu::Matrix<float,4,3>>
            ((Symbol *)local_448,local_520,
             (local_4f8->out0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_4,_3>_>_>
             .m_ptr);
  uVar14 = local_220._32_8_;
  std::__cxx11::string::operator=((string *)local_220._32_8_,(string *)local_448);
  glu::VarType::operator=((VarType *)(uVar14 + 0x20),(VarType *)&local_428);
  glu::VarType::~VarType((VarType *)&local_428);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_448._0_8_ != &local_438) {
    operator_delete((void *)local_448._0_8_,local_438._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_448);
  (*local_4e0->_vptr_Statement[2])(local_4e0,local_448);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_448);
  std::ios_base::~ios_base(local_3d8);
  std::__cxx11::string::operator=((string *)&local_1c8,(string *)local_1a8);
  if ((pointer)local_1a8._0_8_ != pcVar9) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  pPVar13 = local_520;
  pSVar21 = ShaderExecUtil::createExecutor
                      ((local_520->m_ctx).renderContext,(local_520->m_ctx).shaderType,
                       (ShaderSpec *)local_220);
  sVar28 = local_4d8;
  local_448._0_8_ =
       (local_4e8->in0).
       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_448._8_8_ =
       (local_4e8->in1).
       super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_438._M_allocated_capacity =
       (size_type)
       (local_4e8->in2).
       super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_438._8_8_ =
       (local_4e8->in3).
       super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_1a8._0_8_ =
       local_278.out0.
       super__Vector_base<tcu::Matrix<float,_4,_3>,_std::allocator<tcu::Matrix<float,_4,_3>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_1a8._8_8_ =
       local_278.out1.
       super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (*pSVar21->_vptr_ShaderExecutor[3])
            (pSVar21,((pPVar13->super_TestCase).super_TestNode.m_testCtx)->m_log);
  iVar16 = (*pSVar21->_vptr_ShaderExecutor[2])(pSVar21);
  if ((char)iVar16 == '\0') {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Shader compilation failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsBuiltinPrecisionTests.cpp"
               ,0x11d4);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  (*pSVar21->_vptr_ShaderExecutor[5])(pSVar21);
  (*pSVar21->_vptr_ShaderExecutor[6])(pSVar21,sVar28 & 0xffffffff,local_448,local_1a8);
  (*pSVar21->_vptr_ShaderExecutor[1])(pSVar21);
  pVVar32 = local_4f8;
  lVar22 = 8;
  do {
    local_1a8[lVar22 + -8] = 0;
    *(undefined8 *)(local_1a8 + lVar22) = 0x7ff0000000000000;
    *(undefined8 *)(local_1a8 + lVar22 + 8) = 0xfff0000000000000;
    lVar22 = lVar22 + 0x18;
  } while (lVar22 != 0x68);
  lVar22 = 8;
  do {
    local_1a8[lVar22 + -8] = 0;
    *(undefined8 *)(local_1a8 + lVar22) = 0x7ff0000000000000;
    *(undefined8 *)(local_1a8 + lVar22 + 8) = 0xfff0000000000000;
    lVar22 = lVar22 + 0x18;
  } while (lVar22 != 0x68);
  lVar22 = 8;
  do {
    *(undefined1 *)((long)&local_4d0 + lVar22) = 0;
    *(undefined8 *)(local_4c8 + lVar22) = 0x7ff0000000000000;
    *(undefined8 *)(local_4c8 + lVar22 + 8) = 0xfff0000000000000;
    lVar22 = lVar22 + 0x18;
  } while (lVar22 != 0x50);
  lVar22 = 8;
  do {
    *(undefined1 *)((long)&local_4d0 + lVar22) = 0;
    *(undefined8 *)(local_4c8 + lVar22) = 0x7ff0000000000000;
    *(undefined8 *)(local_4c8 + lVar22 + 8) = 0xfff0000000000000;
    lVar22 = lVar22 + 0x18;
  } while (lVar22 != 0x50);
  tcu::Matrix<tcu::Interval,_4,_3>::Matrix((Matrix<tcu::Interval,_4,_3> *)local_448);
  Environment::bind<tcu::Vector<float,4>>
            ((Environment *)&local_2a8,
             (pVVar32->in0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_4>_>_>
             .m_ptr,(IVal *)local_1a8);
  Environment::bind<tcu::Vector<float,3>>
            ((Environment *)&local_2a8,
             (pVVar32->in1).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_3>_>_>
             .m_ptr,(IVal *)local_4c8);
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)&local_2a8,
             (pVVar32->in2).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
             .m_ptr,(IVal *)local_518);
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)&local_2a8,
             (pVVar32->in3).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
             .m_ptr,(IVal *)&local_468);
  Environment::bind<tcu::Matrix<float,4,3>>
            ((Environment *)&local_2a8,
             (pVVar32->out0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_4,_3>_>_>
             .m_ptr,(IVal *)local_448);
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)&local_2a8,
             (pVVar32->out1).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
             .m_ptr,&local_4e9);
  if (pVVar6 == pVVar5) {
LAB_0076651a:
    local_448._0_8_ = ((local_520->super_TestCase).super_TestNode.m_testCtx)->m_log;
    poVar3 = (ostringstream *)(local_448 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"All ",4);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3," inputs passed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_448,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    local_2b8 = &local_520->m_status;
    local_2c0 = sVar28 + (sVar28 == 0);
    uVar31 = 0;
    local_4d0 = 0;
    local_2b0 = &(pPVar13->m_ctx).floatFormat;
    do {
      tcu::Matrix<tcu::Interval,_4,_3>::Matrix((Matrix<tcu::Interval,_4,_3> *)local_1a8);
      if ((uVar31 & 0xfff) == 0) {
        tcu::TestContext::touchWatchdog((local_520->super_TestCase).super_TestNode.m_testCtx);
      }
      fmt = local_2b0;
      pVVar5 = (local_4e8->in0).
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start + uVar31;
      local_518 = *(undefined1 (*) [8])pVVar5->m_data;
      sStack_510 = *(size_type *)(pVVar5->m_data + 2);
      ContainerTraits<tcu::Vector<float,_4>,_tcu::Vector<tcu::Interval,_4>_>::doRound
                ((IVal *)local_4c8,local_2b0,(Vector<float,_4> *)local_518);
      pVVar32 = local_4f8;
      ContainerTraits<tcu::Vector<float,_4>,_tcu::Vector<tcu::Interval,_4>_>::doConvert
                ((IVal *)local_448,fmt,(IVal *)local_4c8);
      pIVar23 = Environment::lookup<tcu::Vector<float,4>>
                          ((Environment *)&local_2a8,
                           (pVVar32->in0).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_4>_>_>
                           .m_ptr);
      puVar29 = (undefined8 *)local_448;
      for (lVar22 = 0xc; lVar22 != 0; lVar22 = lVar22 + -1) {
        *(undefined8 *)pIVar23->m_data = *puVar29;
        puVar29 = puVar29 + (ulong)bVar33 * -2 + 1;
        pIVar23 = (IVal *)((long)pIVar23 + ((ulong)bVar33 * -2 + 1) * 8);
      }
      pVVar7 = (local_4e8->in1).
               super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      sStack_510 = CONCAT44(sStack_510._4_4_,pVVar7[uVar31].m_data[2]);
      local_518 = *(undefined1 (*) [8])pVVar7[uVar31].m_data;
      ContainerTraits<tcu::Vector<float,_3>,_tcu::Vector<tcu::Interval,_3>_>::doRound
                ((IVal *)local_4c8,fmt,(Vector<float,_3> *)local_518);
      ContainerTraits<tcu::Vector<float,_3>,_tcu::Vector<tcu::Interval,_3>_>::doConvert
                ((IVal *)local_448,fmt,(IVal *)local_4c8);
      pIVar24 = Environment::lookup<tcu::Vector<float,3>>
                          ((Environment *)&local_2a8,
                           (pVVar32->in1).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_3>_>_>
                           .m_ptr);
      puVar29 = (undefined8 *)local_448;
      for (lVar22 = 9; lVar22 != 0; lVar22 = lVar22 + -1) {
        *(undefined8 *)pIVar24->m_data = *puVar29;
        puVar29 = puVar29 + (ulong)bVar33 * -2 + 1;
        pIVar24 = (IVal *)((long)pIVar24 + ((ulong)bVar33 * -2 + 1) * 8);
      }
      Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>
                ((Environment *)&local_2a8,
                 (pVVar32->in2).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                 .m_ptr);
      Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>
                ((Environment *)&local_2a8,
                 (pVVar32->in3).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                 .m_ptr);
      local_420.basic.type = (local_520->m_ctx).precision;
      local_428 = fmt->m_maxValue;
      local_448._0_8_ = *(undefined8 *)fmt;
      local_448._8_8_ = *(undefined8 *)&fmt->m_fractionBits;
      local_438._M_allocated_capacity = *(undefined8 *)&fmt->m_hasInf;
      local_438._8_8_ = *(undefined8 *)&fmt->m_exactPrecision;
      local_410[0].m_hasNaN = false;
      local_410[0]._1_3_ = 0;
      local_420._8_8_ = &local_2a8;
      (*local_4e0->_vptr_Statement[3])(local_4e0,local_448);
      pIVar25 = Environment::lookup<tcu::Matrix<float,4,3>>
                          ((Environment *)&local_2a8,
                           (pVVar32->out0).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_4,_3>_>_>
                           .m_ptr);
      __return_storage_ptr__ = (Interval *)local_448;
      ContainerTraits<tcu::Matrix<float,_4,_3>,_tcu::Matrix<tcu::Interval,_4,_3>_>::doConvert
                ((IVal *)__return_storage_ptr__,&local_248,pIVar25);
      puVar27 = local_1a8;
      lVar22 = 0;
      do {
        lVar30 = 0;
        do {
          *(undefined8 *)(puVar27 + lVar30 + 0x10) =
               *(undefined8 *)((long)&__return_storage_ptr__->m_hi + lVar30);
          pbVar1 = &((Vector<tcu::Vector<tcu::Interval,_4>,_3> *)&__return_storage_ptr__->m_hasNaN)
                    ->m_data[0].m_data[0].m_hasNaN + lVar30;
          dVar12 = *(double *)(pbVar1 + 8);
          *(undefined8 *)(puVar27 + lVar30) = *(undefined8 *)pbVar1;
          *(double *)((long)(puVar27 + lVar30) + 8) = dVar12;
          lVar30 = lVar30 + 0x60;
        } while (lVar30 != 0x120);
        lVar22 = lVar22 + 1;
        puVar27 = puVar27 + 0x18;
        __return_storage_ptr__ = __return_storage_ptr__ + 1;
      } while (lVar22 != 4);
      bVar15 = contains<tcu::Matrix<float,4,3>>
                         ((IVal *)local_1a8,
                          local_278.out0.
                          super__Vector_base<tcu::Matrix<float,_4,_3>,_std::allocator<tcu::Matrix<float,_4,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + uVar31);
      local_448._0_8_ = &local_438;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_448,"Shader output 0 is outside acceptable range","");
      bVar15 = tcu::ResultCollector::check(local_2b8,bVar15,(string *)local_448);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_448._0_8_ != &local_438) {
        operator_delete((void *)local_448._0_8_,(ulong)(local_438._M_allocated_capacity + 1));
      }
      pVVar32 = local_4f8;
      if (!bVar15) {
        uVar17 = (int)local_4d0 + 1;
        local_4d0 = (ulong)uVar17;
        if ((int)uVar17 < 0x65) {
          local_448._0_8_ = ((local_520->super_TestCase).super_TestNode.m_testCtx)->m_log;
          poVar3 = (ostringstream *)(local_448 + 8);
          std::__cxx11::ostringstream::ostringstream(poVar3);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"Failed",6);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3," sample:\n",9);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"\t",1);
          pVVar8 = (pVVar32->in0).
                   super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_4>_>_>
                   .m_ptr;
          val = (Vector<float,_4> *)local_4b8;
          pcVar9 = (pVVar8->m_name)._M_dataplus._M_p;
          local_4c8._0_8_ = val;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_4c8,pcVar9,pcVar9 + (pVVar8->m_name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_448 + 8),(char *)local_4c8._0_8_,
                     CONCAT44(local_4c8._12_4_,local_4c8._8_4_));
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_448 + 8)," = ",3);
          valueToString<tcu::Vector<float,4>>
                    ((string *)local_518,(BuiltinPrecisionTests *)&local_248,
                     (FloatFormat *)
                     ((local_4e8->in0).
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + uVar31),val);
          poVar4 = (ostream *)(local_448 + 8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)local_518,sStack_510);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
          if (local_518 != (undefined1  [8])(local_518 + 0x10)) {
            operator_delete((void *)local_518,local_508._M_allocated_capacity + 1);
          }
          if ((Vector<float,_4> *)local_4c8._0_8_ != (Vector<float,_4> *)local_4b8) {
            operator_delete((void *)local_4c8._0_8_,
                            (ulong)((long)(_Rb_tree_color *)local_4b8._0_8_ + 1));
          }
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\t",1);
          pVVar10 = (pVVar32->in1).
                    super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_3>_>_>
                    .m_ptr;
          val_00 = (Vector<float,_3> *)local_4b8;
          pcVar9 = (pVVar10->m_name)._M_dataplus._M_p;
          local_4c8._0_8_ = val_00;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_4c8,pcVar9,pcVar9 + (pVVar10->m_name)._M_string_length);
          poVar4 = (ostream *)(local_448 + 8);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar4,(char *)local_4c8._0_8_,CONCAT44(local_4c8._12_4_,local_4c8._8_4_));
          std::__ostream_insert<char,std::char_traits<char>>(poVar4," = ",3);
          valueToString<tcu::Vector<float,3>>
                    ((string *)local_518,(BuiltinPrecisionTests *)&local_248,
                     (FloatFormat *)
                     ((local_4e8->in1).
                      super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + uVar31),val_00);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)local_518,sStack_510);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
          if (local_518 != (undefined1  [8])(local_518 + 0x10)) {
            operator_delete((void *)local_518,local_508._M_allocated_capacity + 1);
          }
          if ((Vector<float,_3> *)local_4c8._0_8_ != (Vector<float,_3> *)local_4b8) {
            operator_delete((void *)local_4c8._0_8_,
                            (ulong)((long)(_Rb_tree_color *)local_4b8._0_8_ + 1));
          }
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\t",1);
          pVVar11 = (pVVar32->out0).
                    super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_4,_3>_>_>
                    .m_ptr;
          pIVar25 = (IVal *)local_4b8;
          pcVar9 = (pVVar11->m_name)._M_dataplus._M_p;
          local_4c8._0_8_ = pIVar25;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_4c8,pcVar9,pcVar9 + (pVVar11->m_name)._M_string_length);
          poVar4 = (ostream *)(local_448 + 8);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar4,(char *)local_4c8._0_8_,CONCAT44(local_4c8._12_4_,local_4c8._8_4_));
          std::__ostream_insert<char,std::char_traits<char>>(poVar4," = ",3);
          valueToString<tcu::Matrix<float,4,3>>
                    ((string *)local_518,(BuiltinPrecisionTests *)&local_248,
                     (FloatFormat *)
                     (local_278.out0.
                      super__Vector_base<tcu::Matrix<float,_4,_3>,_std::allocator<tcu::Matrix<float,_4,_3>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + uVar31),
                     (Matrix<float,_4,_3> *)pIVar25);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)local_518,sStack_510);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\tExpected range: ",0x11);
          intervalToString<tcu::Matrix<float,4,3>>
                    (&local_468,(BuiltinPrecisionTests *)&local_248,(FloatFormat *)local_1a8,pIVar25
                    );
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar4,local_468._M_dataplus._M_p,local_468._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_468._M_dataplus._M_p != &local_468.field_2) {
            operator_delete(local_468._M_dataplus._M_p,local_468.field_2._M_allocated_capacity + 1);
          }
          if (local_518 != (undefined1  [8])(local_518 + 0x10)) {
            operator_delete((void *)local_518,local_508._M_allocated_capacity + 1);
          }
          if ((IVal *)local_4c8._0_8_ != (IVal *)local_4b8) {
            operator_delete((void *)local_4c8._0_8_,
                            (ulong)((long)(_Rb_tree_color *)local_4b8._0_8_ + 1));
          }
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_448,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_448 + 8));
          std::ios_base::~ios_base(local_3d0);
        }
      }
      uVar31 = uVar31 + 1;
    } while (uVar31 != local_2c0);
    iVar16 = (int)local_4d0;
    if (iVar16 < 0x65) {
      if (iVar16 == 0) goto LAB_0076651a;
    }
    else {
      local_448._0_8_ = ((local_520->super_TestCase).super_TestNode.m_testCtx)->m_log;
      poVar3 = (ostringstream *)(local_448 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar3);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"(Skipped ",9);
      std::ostream::operator<<(poVar3,iVar16 + -100);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3," messages.)",0xb);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_448,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar3);
      std::ios_base::~ios_base(local_3d0);
    }
    local_448._0_8_ = ((local_520->super_TestCase).super_TestNode.m_testCtx)->m_log;
    poVar3 = (ostringstream *)(local_448 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar3);
    std::ostream::operator<<(poVar3,iVar16);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"/",1);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3," inputs failed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_448,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_448 + 8));
  std::ios_base::~ios_base(local_3d0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  ::~_Rb_tree(&local_2a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_p != &local_1b8) {
    operator_delete(local_1c8._M_p,
                    CONCAT71(local_1b8._M_allocated_capacity._1_7_,local_1b8._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_p != &local_1d8) {
    operator_delete(local_1e8._M_p,
                    CONCAT71(local_1d8._M_allocated_capacity._1_7_,local_1d8._M_local_buf[0]) + 1);
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::~vector((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
             *)(local_220 + 0x20));
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::~vector((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
             *)(local_220 + 8));
  if (local_278.out1.
      super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_278.out1.
                    super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_278.out1.
                          super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_278.out1.
                          super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_278.out0.
      super__Vector_base<tcu::Matrix<float,_4,_3>,_std::allocator<tcu::Matrix<float,_4,_3>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_278.out0.
                    super__Vector_base<tcu::Matrix<float,_4,_3>,_std::allocator<tcu::Matrix<float,_4,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_278.out0.
                          super__Vector_base<tcu::Matrix<float,_4,_3>,_std::allocator<tcu::Matrix<float,_4,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_278.out0.
                          super__Vector_base<tcu::Matrix<float,_4,_3>,_std::allocator<tcu::Matrix<float,_4,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void PrecisionCase::testStatement (const Variables<In, Out>&	variables,
								   const Inputs<In>&			inputs,
								   const Statement&				stmt)
{
	using namespace ShaderExecUtil;

	typedef typename	In::In0		In0;
	typedef typename	In::In1		In1;
	typedef typename	In::In2		In2;
	typedef typename	In::In3		In3;
	typedef typename	Out::Out0	Out0;
	typedef typename	Out::Out1	Out1;

	const FloatFormat&	fmt			= getFormat();
	const int			inCount		= numInputs<In>();
	const int			outCount	= numOutputs<Out>();
	const size_t		numValues	= (inCount > 0) ? inputs.in0.size() : 1;
	Outputs<Out>		outputs		(numValues);
	ShaderSpec			spec;
	const FloatFormat	highpFmt	= m_ctx.highpFormat;
	const int			maxMsgs		= 100;
	int					numErrors	= 0;
	Environment			env;		// Hoisted out of the inner loop for optimization.

	switch (inCount)
	{
		case 4: DE_ASSERT(inputs.in3.size() == numValues);
		case 3: DE_ASSERT(inputs.in2.size() == numValues);
		case 2: DE_ASSERT(inputs.in1.size() == numValues);
		case 1: DE_ASSERT(inputs.in0.size() == numValues);
		default: break;
	}

	// Print out the statement and its definitions
	log() << TestLog::Message << "Statement: " << stmt << TestLog::EndMessage;
	{
		ostringstream	oss;
		FuncSet			funcs;

		stmt.getUsedFuncs(funcs);
		for (FuncSet::const_iterator it = funcs.begin(); it != funcs.end(); ++it)
		{
			(*it)->printDefinition(oss);
		}
		if (!funcs.empty())
			log() << TestLog::Message << "Reference definitions:\n" << oss.str()
				  << TestLog::EndMessage;
	}

	// Initialize ShaderSpec from precision, variables and statement.
	{
		ostringstream os;
		os << "precision " << glu::getPrecisionName(m_ctx.precision) << " float;\n";
		spec.globalDeclarations = os.str();
	}

	spec.version = getContextTypeGLSLVersion(getRenderContext().getType());

	if (!m_extension.empty())
		spec.globalDeclarations = "#extension " + m_extension + " : require\n";

	spec.inputs.resize(inCount);

	switch (inCount)
	{
		case 4: spec.inputs[3] = makeSymbol(*variables.in3);
		case 3:	spec.inputs[2] = makeSymbol(*variables.in2);
		case 2:	spec.inputs[1] = makeSymbol(*variables.in1);
		case 1:	spec.inputs[0] = makeSymbol(*variables.in0);
		default: break;
	}

	spec.outputs.resize(outCount);

	switch (outCount)
	{
		case 2:	spec.outputs[1] = makeSymbol(*variables.out1);
		case 1:	spec.outputs[0] = makeSymbol(*variables.out0);
		default: break;
	}

	spec.source = de::toString(stmt);

	// Run the shader with inputs.
	{
		UniquePtr<ShaderExecutor>	executor		(createExecutor(getRenderContext(),
																	m_ctx.shaderType,
																	spec));
		const void*					inputArr[]		=
		{
			&inputs.in0.front(), &inputs.in1.front(), &inputs.in2.front(), &inputs.in3.front(),
		};
		void*						outputArr[]		=
		{
			&outputs.out0.front(), &outputs.out1.front(),
		};

		executor->log(log());
		if (!executor->isOk())
			TCU_FAIL("Shader compilation failed");

		executor->useProgram();
		executor->execute(int(numValues), inputArr, outputArr);
	}

	// Initialize environment with dummy values so we don't need to bind in inner loop.
	{
		const typename Traits<In0>::IVal		in0;
		const typename Traits<In1>::IVal		in1;
		const typename Traits<In2>::IVal		in2;
		const typename Traits<In3>::IVal		in3;
		const typename Traits<Out0>::IVal		reference0;
		const typename Traits<Out1>::IVal		reference1;

		env.bind(*variables.in0, in0);
		env.bind(*variables.in1, in1);
		env.bind(*variables.in2, in2);
		env.bind(*variables.in3, in3);
		env.bind(*variables.out0, reference0);
		env.bind(*variables.out1, reference1);
	}

	// For each input tuple, compute output reference interval and compare
	// shader output to the reference.
	for (size_t valueNdx = 0; valueNdx < numValues; valueNdx++)
	{
		bool						result		= true;
		typename Traits<Out0>::IVal	reference0;
		typename Traits<Out1>::IVal	reference1;

		if (valueNdx % (size_t)TOUCH_WATCHDOG_VALUE_FREQUENCY == 0)
			m_testCtx.touchWatchdog();

		env.lookup(*variables.in0) = convert<In0>(fmt, round(fmt, inputs.in0[valueNdx]));
		env.lookup(*variables.in1) = convert<In1>(fmt, round(fmt, inputs.in1[valueNdx]));
		env.lookup(*variables.in2) = convert<In2>(fmt, round(fmt, inputs.in2[valueNdx]));
		env.lookup(*variables.in3) = convert<In3>(fmt, round(fmt, inputs.in3[valueNdx]));

		{
			EvalContext	ctx (fmt, m_ctx.precision, env);
			stmt.execute(ctx);
		}

		switch (outCount)
		{
			case 2:
				reference1 = convert<Out1>(highpFmt, env.lookup(*variables.out1));
				if (!m_status.check(contains(reference1, outputs.out1[valueNdx]),
									"Shader output 1 is outside acceptable range"))
					result = false;
			case 1:
				reference0 = convert<Out0>(highpFmt, env.lookup(*variables.out0));
				if (!m_status.check(contains(reference0, outputs.out0[valueNdx]),
									"Shader output 0 is outside acceptable range"))
					result = false;
			default: break;
		}

		if (!result)
			++numErrors;

		if ((!result && numErrors <= maxMsgs) || GLS_LOG_ALL_RESULTS)
		{
			MessageBuilder	builder	= log().message();

			builder << (result ? "Passed" : "Failed") << " sample:\n";

			if (inCount > 0)
			{
				builder << "\t" << variables.in0->getName() << " = "
						<< valueToString(highpFmt, inputs.in0[valueNdx]) << "\n";
			}

			if (inCount > 1)
			{
				builder << "\t" << variables.in1->getName() << " = "
						<< valueToString(highpFmt, inputs.in1[valueNdx]) << "\n";
			}

			if (inCount > 2)
			{
				builder << "\t" << variables.in2->getName() << " = "
						<< valueToString(highpFmt, inputs.in2[valueNdx]) << "\n";
			}

			if (inCount > 3)
			{
				builder << "\t" << variables.in3->getName() << " = "
						<< valueToString(highpFmt, inputs.in3[valueNdx]) << "\n";
			}

			if (outCount > 0)
			{
				builder << "\t" << variables.out0->getName() << " = "
						<< valueToString(highpFmt, outputs.out0[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out0>(highpFmt, reference0) << "\n";
			}

			if (outCount > 1)
			{
				builder << "\t" << variables.out1->getName() << " = "
						<< valueToString(highpFmt, outputs.out1[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out1>(highpFmt, reference1) << "\n";
			}

			builder << TestLog::EndMessage;
		}
	}

	if (numErrors > maxMsgs)
	{
		log() << TestLog::Message << "(Skipped " << (numErrors - maxMsgs) << " messages.)"
			  << TestLog::EndMessage;
	}

	if (numErrors == 0)
	{
		log() << TestLog::Message << "All " << numValues << " inputs passed."
			  << TestLog::EndMessage;
	}
	else
	{
		log() << TestLog::Message << numErrors << "/" << numValues << " inputs failed."
			  << TestLog::EndMessage;
	}
}